

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

void moira::sprintx(char **s,u64 value,DasmNumberFormat *fmt,int digits)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  char local_32;
  int local_30;
  int iStack_2c;
  char digit;
  int i_1;
  int i;
  char a;
  int digits_local;
  DasmNumberFormat *fmt_local;
  u64 value_local;
  char **s_local;
  
  local_32 = 'A';
  if ((fmt->upperCase & 1U) == 0) {
    local_32 = 'a';
  }
  if ((value != 0) || ((fmt->plainZero & 1U) == 0)) {
    for (iStack_2c = 0; fmt->prefix[iStack_2c] != '\0'; iStack_2c = iStack_2c + 1) {
      cVar3 = fmt->prefix[iStack_2c];
      pcVar1 = *s;
      *s = pcVar1 + 1;
      *pcVar1 = cVar3;
    }
  }
  fmt_local = (DasmNumberFormat *)value;
  for (local_30 = digits + -1; -1 < local_30; local_30 = local_30 + -1) {
    bVar2 = (byte)fmt_local & 0xf;
    if (bVar2 < 10) {
      cVar3 = bVar2 + 0x30;
    }
    else {
      cVar3 = local_32 + -10 + bVar2;
    }
    (*s)[local_30] = cVar3;
    fmt_local = (DasmNumberFormat *)((ulong)fmt_local >> 4);
  }
  *s = *s + digits;
  return;
}

Assistant:

static void sprintx(char *&s, u64 value, const DasmNumberFormat &fmt, int digits)
{
    char a = (fmt.upperCase ? 'A' : 'a') - 10;

    if (value || !fmt.plainZero) {

        for (int i = 0; fmt.prefix[i]; i++) *s++ = fmt.prefix[i];
    }
    for (int i = digits - 1; i >= 0; i--) {

        auto digit = char(value % 16);
        s[i] = (digit <= 9) ? ('0' + digit) : (a + digit);
        value /= 16;
    }
    s += digits;
}